

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_prediction_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5564d0::HighbdDrPredTest::HighbdDrPredTest(HighbdDrPredTest *this)

{
  int iVar1;
  undefined8 uVar2;
  _func_void_unsigned_short_ptr_long_int_int_unsigned_short_ptr_unsigned_short_ptr_int_int_int_int_int
  *p_Var3;
  undefined8 *puVar4;
  bool bVar5;
  ostream *poVar6;
  GTestLog local_14;
  
  testing::Test::Test((Test *)this);
  (this->
  super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  ).
  super_TestWithParam<(anonymous_namespace)::DrPredFunc<void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_00ef6b90;
  (this->
  super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  ).
  super_TestWithParam<(anonymous_namespace)::DrPredFunc<void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>_>
  .
  super_WithParamInterface<(anonymous_namespace)::DrPredFunc<void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__DrPredTest_00ef6bd0;
  (this->
  super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  ).enable_upsample_ = 0;
  (this->
  super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  ).upsample_above_ = 0;
  (this->
  super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  ).upsample_left_ = 0;
  (this->
  super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  ).bw_ = 0;
  (this->
  super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  ).bh_ = 0;
  (this->
  super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  ).dx_ = 1;
  (this->
  super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  ).dy_ = 1;
  (this->
  super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  ).bd_ = 8;
  (this->
  super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  ).txsize_ = '\0';
  (this->
  super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  ).rng_.random_.state_ = 0xbaba;
  (this->
  super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  ).params_.ref_fn =
       (_func_void_unsigned_short_ptr_long_int_int_unsigned_short_ptr_unsigned_short_ptr_int_int_int_int_int
        *)0x0;
  (this->
  super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  ).params_.tst_fn =
       (_func_void_unsigned_short_ptr_long_int_int_unsigned_short_ptr_unsigned_short_ptr_int_int_int_int_int
        *)0x0;
  (this->
  super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  ).params_.bit_depth = 0;
  (this->
  super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  ).params_.start_angle = 0;
  bVar5 = testing::internal::IsTrue
                    (testing::
                     WithParamInterface<(anonymous_namespace)::DrPredFunc<void(*)(unsigned_short*,long,int,int,unsigned_short_const*,unsigned_short_const*,int,int,int,int,int)>>
                     ::parameter_ != (undefined8 *)0x0);
  if (!bVar5) {
    testing::internal::GTestLog::GTestLog
              (&local_14,GTEST_FATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/gtest.h"
               ,0x67d);
    poVar6 = std::operator<<((ostream *)&std::cerr,"Condition parameter_ != nullptr failed. ");
    poVar6 = std::operator<<(poVar6,
                             "GetParam() can only be called inside a value-parameterized test ");
    std::operator<<(poVar6,"-- did you intend to write TEST_P instead of TEST_F?");
    testing::internal::GTestLog::~GTestLog(&local_14);
  }
  puVar4 = testing::
           WithParamInterface<(anonymous_namespace)::DrPredFunc<void(*)(unsigned_short*,long,int,int,unsigned_short_const*,unsigned_short_const*,int,int,int,int,int)>>
           ::parameter_;
  uVar2 = testing::
          WithParamInterface<(anonymous_namespace)::DrPredFunc<void(*)(unsigned_short*,long,int,int,unsigned_short_const*,unsigned_short_const*,int,int,int,int,int)>>
          ::parameter_[2];
  (this->
  super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  ).params_.bit_depth = (int)uVar2;
  (this->
  super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  ).params_.start_angle = (int)((ulong)uVar2 >> 0x20);
  p_Var3 = (_func_void_unsigned_short_ptr_long_int_int_unsigned_short_ptr_unsigned_short_ptr_int_int_int_int_int
            *)puVar4[1];
  (this->
  super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  ).params_.ref_fn =
       (_func_void_unsigned_short_ptr_long_int_int_unsigned_short_ptr_unsigned_short_ptr_int_int_int_int_int
        *)*puVar4;
  (this->
  super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  ).params_.tst_fn = p_Var3;
  iVar1 = (this->
          super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
          ).params_.start_angle;
  (this->
  super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  ).start_angle_ = iVar1;
  (this->
  super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  ).stop_angle_ = iVar1 + 0x5a;
  (this->
  super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  ).
  super_TestWithParam<(anonymous_namespace)::DrPredFunc<void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_00ef6b30;
  (this->
  super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  ).
  super_TestWithParam<(anonymous_namespace)::DrPredFunc<void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>_>
  .
  super_WithParamInterface<(anonymous_namespace)::DrPredFunc<void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__HighbdDrPredTest_00ef6b70;
  return;
}

Assistant:

TEST_P(HighbdDrPredTest, SaturatedValues) {
  for (enable_upsample_ = 0; enable_upsample_ < 2; ++enable_upsample_) {
    for (int angle = start_angle_; angle < stop_angle_; ++angle) {
      dx_ = av1_get_dx(angle);
      dy_ = av1_get_dy(angle);
      if (dx_ && dy_) RunTest(false, true, angle);
    }
  }
}